

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::TimeZone::getDisplayName
          (TimeZone *this,UBool daylight,EDisplayType style,Locale *locale,UnicodeString *result)

{
  ushort uVar1;
  UErrorCode UVar2;
  TimeZone *pTVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  TimeZoneFormat *pTVar8;
  UChar *text;
  undefined8 uVar9;
  uint uVar10;
  TimeZoneNames *pTVar11;
  UErrorCode status;
  UTimeZoneFormatTimeType timeType;
  UnicodeString canonicalID;
  UErrorCode local_94;
  TimeZone *local_90;
  int local_84;
  TimeZoneNames *local_80;
  UDate local_78;
  UnicodeString local_70;
  
  local_94 = U_ZERO_ERROR;
  local_90 = this;
  local_78 = Calendar::getNow();
  local_84 = 0;
  if ((style < (GENERIC_LOCATION|SHORT)) && ((0x118U >> (style & 0x1f) & 1) != 0)) {
    pTVar8 = TimeZoneFormat::createInstance(locale,&local_94);
    pTVar3 = local_90;
    UVar2 = local_94;
    if (local_94 < U_ILLEGAL_ARGUMENT_ERROR) {
      if (style == SHORT_GENERIC) {
        uVar9 = 2;
LAB_001f154c:
        (*(pTVar8->super_Format).super_UObject._vptr_UObject[8])
                  (local_78,pTVar8,uVar9,local_90,result,&local_84);
      }
      else {
        if (style == GENERIC_LOCATION) {
          uVar9 = 0;
          goto LAB_001f154c;
        }
        if (style == LONG_GENERIC) {
          uVar9 = 1;
          goto LAB_001f154c;
        }
      }
      if (daylight == '\0' || local_84 != 1) {
        if (daylight != '\0' || local_84 != 2) goto LAB_001f1455;
        iVar7 = (*(pTVar3->super_UObject)._vptr_UObject[8])(pTVar3);
      }
      else {
        iVar5 = (*(pTVar3->super_UObject)._vptr_UObject[8])(pTVar3);
        iVar6 = (*(pTVar3->super_UObject)._vptr_UObject[0xd])(pTVar3);
        iVar7 = iVar6 + iVar5;
      }
      if (style == SHORT_GENERIC) {
        TimeZoneFormat::formatOffsetShortLocalizedGMT(pTVar8,iVar7,result,&local_94);
      }
      else {
        TimeZoneFormat::formatOffsetLocalizedGMT(pTVar8,iVar7,result,&local_94);
      }
    }
    else {
      uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
      uVar4 = 2;
      if ((uVar1 & 1) == 0) {
        uVar4 = uVar1 & 0x1e;
      }
      (result->fUnion).fStackFields.fLengthAndFlags = uVar4;
    }
LAB_001f1455:
    if (pTVar8 != (TimeZoneFormat *)0x0) {
      (*(pTVar8->super_Format).super_UObject._vptr_UObject[1])(pTVar8);
    }
  }
  else {
    if (1 < style - SHORT_GMT) {
      if ((style == SHORT) || (style == SHORT_COMMONLY_USED)) {
        uVar10 = (uint)(daylight != '\0') * 0x10 + 0x10;
      }
      else {
        uVar10 = 0;
        if (style == LONG) {
          uVar10 = (uint)(daylight != '\0') * 2 + 2;
        }
      }
      local_80 = TimeZoneNames::createInstance(locale,&local_94);
      if (U_ZERO_ERROR < local_94) {
        uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
        uVar4 = 2;
        if ((uVar1 & 1) == 0) {
          uVar4 = uVar1 & 0x1e;
        }
        (result->fUnion).fStackFields.fLengthAndFlags = uVar4;
        if (local_80 == (TimeZoneNames *)0x0) {
          return result;
        }
        (*(local_80->super_UObject)._vptr_UObject[1])(local_80);
        return result;
      }
      text = ZoneMeta::getCanonicalCLDRID(local_90);
      UnicodeString::UnicodeString(&local_70,text);
      pTVar11 = local_80;
      (*(local_80->super_UObject)._vptr_UObject[0xc])
                (local_78,local_80,&local_70,(ulong)uVar10,result);
      if ((ushort)(result->fUnion).fStackFields.fLengthAndFlags < 0x20) {
        pTVar8 = TimeZoneFormat::createInstance(locale,&local_94);
        if ((daylight == '\0') ||
           (iVar5 = (*(local_90->super_UObject)._vptr_UObject[9])(), pTVar3 = local_90,
           (char)iVar5 == '\0')) {
          iVar7 = (*(local_90->super_UObject)._vptr_UObject[8])();
        }
        else {
          iVar5 = (*(local_90->super_UObject)._vptr_UObject[8])(local_90);
          iVar6 = (*(pTVar3->super_UObject)._vptr_UObject[0xd])(pTVar3);
          iVar7 = iVar6 + iVar5;
        }
        if (style == LONG) {
          TimeZoneFormat::formatOffsetLocalizedGMT(pTVar8,iVar7,result,&local_94);
        }
        else {
          TimeZoneFormat::formatOffsetShortLocalizedGMT(pTVar8,iVar7,result,&local_94);
        }
        pTVar11 = local_80;
        if (pTVar8 != (TimeZoneFormat *)0x0) {
          (*(pTVar8->super_Format).super_UObject._vptr_UObject[1])(pTVar8);
        }
      }
      UnicodeString::~UnicodeString(&local_70);
      (*(pTVar11->super_UObject)._vptr_UObject[1])(pTVar11);
      goto LAB_001f146d;
    }
    pTVar8 = TimeZoneFormat::createInstance(locale,&local_94);
    pTVar3 = local_90;
    local_78 = (UDate)CONCAT44(local_78._4_4_,local_94);
    if (local_94 < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((daylight == '\0') ||
         (iVar5 = (*(local_90->super_UObject)._vptr_UObject[9])(local_90), (char)iVar5 == '\0')) {
        iVar7 = (*(pTVar3->super_UObject)._vptr_UObject[8])(pTVar3);
      }
      else {
        iVar5 = (*(pTVar3->super_UObject)._vptr_UObject[8])(pTVar3);
        iVar6 = (*(pTVar3->super_UObject)._vptr_UObject[0xd])(pTVar3);
        iVar7 = iVar6 + iVar5;
      }
      if (style == LONG_GMT) {
        TimeZoneFormat::formatOffsetLocalizedGMT(pTVar8,iVar7,result,&local_94);
      }
      else {
        TimeZoneFormat::formatOffsetISO8601Basic(pTVar8,iVar7,'\0','\0','\0',result,&local_94);
      }
    }
    else {
      uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
      uVar4 = 2;
      if ((uVar1 & 1) == 0) {
        uVar4 = uVar1 & 0x1e;
      }
      (result->fUnion).fStackFields.fLengthAndFlags = uVar4;
    }
    if (pTVar8 != (TimeZoneFormat *)0x0) {
      (*(pTVar8->super_Format).super_UObject._vptr_UObject[1])(pTVar8);
    }
    UVar2 = local_78._0_4_;
  }
  if (U_ZERO_ERROR < UVar2) {
    return result;
  }
LAB_001f146d:
  if (U_ZERO_ERROR < local_94) {
    uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
    uVar4 = 2;
    if ((uVar1 & 1) == 0) {
      uVar4 = uVar1 & 0x1e;
    }
    (result->fUnion).fStackFields.fLengthAndFlags = uVar4;
  }
  return result;
}

Assistant:

UnicodeString&
TimeZone::getDisplayName(UBool daylight, EDisplayType style, const Locale& locale, UnicodeString& result) const
{
    UErrorCode status = U_ZERO_ERROR;
    UDate date = Calendar::getNow();
    UTimeZoneFormatTimeType timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    int32_t offset;

    if (style == GENERIC_LOCATION || style == LONG_GENERIC || style == SHORT_GENERIC) {
        LocalPointer<TimeZoneFormat> tzfmt(TimeZoneFormat::createInstance(locale, status));
        if (U_FAILURE(status)) {
            result.remove();
            return result;
        }
        // Generic format
        switch (style) {
        case GENERIC_LOCATION:
            tzfmt->format(UTZFMT_STYLE_GENERIC_LOCATION, *this, date, result, &timeType);
            break;
        case LONG_GENERIC:
            tzfmt->format(UTZFMT_STYLE_GENERIC_LONG, *this, date, result, &timeType);
            break;
        case SHORT_GENERIC:
            tzfmt->format(UTZFMT_STYLE_GENERIC_SHORT, *this, date, result, &timeType);
            break;
        default:
            U_ASSERT(FALSE);
        }
        // Generic format many use Localized GMT as the final fallback.
        // When Localized GMT format is used, the result might not be
        // appropriate for the requested daylight value.
        if ((daylight && timeType == UTZFMT_TIME_TYPE_STANDARD) || (!daylight && timeType == UTZFMT_TIME_TYPE_DAYLIGHT)) {
            offset = daylight ? getRawOffset() + getDSTSavings() : getRawOffset();
            if (style == SHORT_GENERIC) {
                tzfmt->formatOffsetShortLocalizedGMT(offset, result, status);
            } else {
                tzfmt->formatOffsetLocalizedGMT(offset, result, status);
            }
        }
    } else if (style == LONG_GMT || style == SHORT_GMT) {
        LocalPointer<TimeZoneFormat> tzfmt(TimeZoneFormat::createInstance(locale, status));
        if (U_FAILURE(status)) {
            result.remove();
            return result;
        }
        offset = daylight && useDaylightTime() ? getRawOffset() + getDSTSavings() : getRawOffset();
        switch (style) {
        case LONG_GMT:
            tzfmt->formatOffsetLocalizedGMT(offset, result, status);
            break;
        case SHORT_GMT:
            tzfmt->formatOffsetISO8601Basic(offset, FALSE, FALSE, FALSE, result, status);
            break;
        default:
            U_ASSERT(FALSE);
        }

    } else {
        U_ASSERT(style == LONG || style == SHORT || style == SHORT_COMMONLY_USED);
        UTimeZoneNameType nameType = UTZNM_UNKNOWN;
        switch (style) {
        case LONG:
            nameType = daylight ? UTZNM_LONG_DAYLIGHT : UTZNM_LONG_STANDARD;
            break;
        case SHORT:
        case SHORT_COMMONLY_USED:
            nameType = daylight ? UTZNM_SHORT_DAYLIGHT : UTZNM_SHORT_STANDARD;
            break;
        default:
            U_ASSERT(FALSE);
        }
        LocalPointer<TimeZoneNames> tznames(TimeZoneNames::createInstance(locale, status));
        if (U_FAILURE(status)) {
            result.remove();
            return result;
        }
        UnicodeString canonicalID(ZoneMeta::getCanonicalCLDRID(*this));
        tznames->getDisplayName(canonicalID, nameType, date, result);
        if (result.isEmpty()) {
            // Fallback to localized GMT
            LocalPointer<TimeZoneFormat> tzfmt(TimeZoneFormat::createInstance(locale, status));
            offset = daylight && useDaylightTime() ? getRawOffset() + getDSTSavings() : getRawOffset();
            if (style == LONG) {
                tzfmt->formatOffsetLocalizedGMT(offset, result, status);
            } else {
                tzfmt->formatOffsetShortLocalizedGMT(offset, result, status);
            }
        }
    }
    if (U_FAILURE(status)) {
        result.remove();
    }
    return  result;
}